

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O2

void cfd::api::CollectUtxoDataByFundRawTransaction
               (ConfidentialTransactionContext *ctx,
               vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
               *selected_txin_utxos,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *txin_amount_map,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *tx_amount_map,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *asset_list,int32_t *fee_index)

{
  _Rb_tree_header *p_Var1;
  Txid *pTVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  pointer pEVar6;
  char cVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  iterator iVar9;
  long lVar10;
  mapped_type *pmVar11;
  _Rb_tree_header *p_Var12;
  iterator iVar13;
  mapped_type *pmVar14;
  __normal_iterator<cfd::core::OutPoint_*,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>
  _Var15;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  ulong uVar16;
  bool bVar17;
  long lVar18;
  pointer pEVar19;
  initializer_list<cfd::core::OutPoint> __l;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> outpoint_list;
  long local_170;
  undefined1 local_168;
  string asset;
  string asset_2;
  string asset_1;
  string token;
  BlindFactor asset_entropy;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
  asset_utxo_map;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txin_list;
  long local_58;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txout_list;
  long local_40;
  
  cfd::core::ConfidentialTransaction::GetTxOutList();
  p_Var1 = &(tx_amount_map->_M_t)._M_impl.super__Rb_tree_header;
  lVar18 = 0x78;
  for (uVar16 = 0; lVar10 = _txout_list, uVar16 < (ulong)((local_40 - _txout_list) / 0xf8);
      uVar16 = uVar16 + 1) {
    cfd::core::Script::Script((Script *)&asset_utxo_map,(Script *)(_txout_list + lVar18 + -0x60));
    cVar7 = cfd::core::Script::IsEmpty();
    core::Script::~Script((Script *)&asset_utxo_map);
    if (cVar7 == '\0') {
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&asset_utxo_map,
                 (ConfidentialAssetId *)(lVar10 + lVar18 + -0x28));
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&asset_utxo_map);
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((asset_list->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (asset_list->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&asset);
      if (_Var8._M_current ==
          (asset_list->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(asset_list,&asset);
      }
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::find(&tx_amount_map->_M_t,&asset);
      if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
        asset_utxo_map._M_t._M_impl._0_8_ = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
        ::_M_emplace_unique<std::__cxx11::string&,long&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                    *)tx_amount_map,&asset,(long *)&asset_utxo_map);
      }
      cfd::core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&asset_utxo_map,(ConfidentialValue *)(lVar10 + lVar18));
      asset_1._M_dataplus._M_p = (pointer)cfd::core::ConfidentialValue::GetAmount();
      asset_1._M_string_length._0_1_ = extraout_DL;
      lVar10 = cfd::core::Amount::GetSatoshiValue();
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                ::operator[](tx_amount_map,&asset);
      *pmVar11 = *pmVar11 + lVar10;
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&asset_utxo_map);
      std::__cxx11::string::~string((string *)&asset);
    }
    else {
      *fee_index = (int32_t)uVar16;
    }
    lVar18 = lVar18 + 0xf8;
  }
  asset_utxo_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &asset_utxo_map._M_t._M_impl.super__Rb_tree_header._M_header;
  asset_utxo_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  asset_utxo_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  asset_utxo_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  asset_utxo_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       asset_utxo_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialTransaction::GetTxInList();
  pEVar6 = (selected_txin_utxos->
           super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  p_Var12 = &(txin_amount_map->_M_t)._M_impl.super__Rb_tree_header;
  for (pEVar19 = (selected_txin_utxos->
                 super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                 )._M_impl.super__Vector_impl_data._M_start; pEVar19 != pEVar6;
      pEVar19 = pEVar19 + 1) {
    pTVar2 = &(pEVar19->utxo).txid;
    for (lVar18 = _txin_list; lVar18 != local_58; lVar18 = lVar18 + 0x160) {
      cfd::core::Txid::Txid((Txid *)&asset,(Txid *)(lVar18 + 8));
      cVar7 = cfd::core::Txid::Equals((Txid *)&asset);
      if (cVar7 == '\0') {
        core::Txid::~Txid((Txid *)&asset);
      }
      else {
        uVar3 = (pEVar19->utxo).vout;
        uVar4 = *(uint32_t *)(lVar18 + 0x28);
        core::Txid::~Txid((Txid *)&asset);
        if (uVar3 == uVar4) {
          cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((asset_list->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (asset_list->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,&asset_1);
          if (_Var8._M_current ==
              (asset_list->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(asset_list,&asset_1);
          }
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                   ::find(&asset_utxo_map._M_t,&asset_1);
          if ((_Rb_tree_header *)iVar13._M_node ==
              &asset_utxo_map._M_t._M_impl.super__Rb_tree_header) {
            cfd::core::OutPoint::OutPoint((OutPoint *)&asset,pTVar2,(pEVar19->utxo).vout);
            __l._M_len = 1;
            __l._M_array = (OutPoint *)&asset;
            std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
                      (&outpoint_list,__l,(allocator_type *)&asset_entropy);
            core::Txid::~Txid((Txid *)&asset);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                      ::operator[](&asset_utxo_map,&asset_1);
            std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
                      (pmVar14,&outpoint_list);
            std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::~vector
                      (&outpoint_list);
          }
          else {
            cfd::core::OutPoint::OutPoint((OutPoint *)&asset,pTVar2,(pEVar19->utxo).vout);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                      ::operator[](&asset_utxo_map,&asset_1);
            std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::push_back
                      (pmVar14,(OutPoint *)&asset);
            core::Txid::~Txid((Txid *)&asset);
          }
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  ::find(&txin_amount_map->_M_t,&asset_1);
          if ((_Rb_tree_header *)iVar9._M_node == p_Var12) {
            asset._M_dataplus._M_p = (pointer)0x0;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
            ::_M_emplace_unique<std::__cxx11::string&,long&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                        *)txin_amount_map,&asset_1,(long *)&asset);
          }
          lVar18 = cfd::core::Amount::GetSatoshiValue();
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::operator[](txin_amount_map,&asset_1);
          *pmVar11 = *pmVar11 + lVar18;
          std::__cxx11::string::~string((string *)&asset_1);
          break;
        }
      }
    }
  }
  lVar18 = _txin_list;
  do {
    if (lVar18 == local_58) {
      std::
      vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ::~vector(&txin_list);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
      ::~_Rb_tree(&asset_utxo_map._M_t);
      std::
      vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ::~vector(&txout_list);
      return;
    }
    __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar18 + 0x90);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset,__x);
    cVar7 = cfd::core::ByteData256::IsEmpty();
    if (cVar7 == '\0') {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
LAB_00237f5c:
      cfd::core::BlindFactor::BlindFactor(&asset_entropy);
      token._M_dataplus._M_p = (pointer)&token.field_2;
      token._M_string_length = 0;
      token.field_2._M_local_buf[0] = '\0';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset,__x);
      cVar7 = cfd::core::ByteData256::IsEmpty();
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
      if (cVar7 == '\0') {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar18 + 0xa8));
        cfd::core::BlindFactor::BlindFactor((BlindFactor *)&asset,(ByteData256 *)&asset_1);
        cfd::core::BlindFactor::operator=(&asset_entropy,(BlindFactor *)&asset);
        core::BlindFactor::~BlindFactor((BlindFactor *)&asset);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_1);
      }
      else {
        cfd::core::Txid::Txid((Txid *)&asset_1,(Txid *)(lVar18 + 8));
        uVar5 = *(uint *)(lVar18 + 0x28);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint_list,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar18 + 0xa8));
        cfd::core::ConfidentialTransaction::CalculateAssetEntropy
                  ((Txid *)&asset,(uint)(ConfidentialAssetId *)&asset_1,(ByteData256 *)(ulong)uVar5)
        ;
        cfd::core::BlindFactor::operator=(&asset_entropy,(BlindFactor *)&asset);
        core::BlindFactor::~BlindFactor((BlindFactor *)&asset);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint_list);
        core::Txid::~Txid((Txid *)&asset_1);
        bVar17 = SUB81(&asset_entropy,0);
        cfd::core::ConfidentialTransaction::CalculateReissuanceToken((BlindFactor *)&asset,bVar17);
        cfd::core::ConfidentialTransaction::CalculateReissuanceToken((BlindFactor *)&asset_1,bVar17)
        ;
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                ::find(&tx_amount_map->_M_t,(key_type *)&outpoint_list);
        if (((_Rb_tree_header *)iVar9._M_node != p_Var1) ||
           (iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::find(&tx_amount_map->_M_t,&asset_2),
           (_Rb_tree_header *)iVar9._M_node != p_Var1)) {
          std::__cxx11::string::_M_assign((string *)&token);
        }
        std::__cxx11::string::~string((string *)&asset_2);
        std::__cxx11::string::~string((string *)&outpoint_list);
        core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&asset_1);
        core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&asset);
      }
      cfd::core::ConfidentialTransaction::CalculateAsset((BlindFactor *)&asset);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_1,__x);
      cVar7 = cfd::core::ByteData256::IsEmpty();
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_1);
      if (cVar7 == '\0') {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                ::find(&txin_amount_map->_M_t,&asset_2);
        if ((_Rb_tree_header *)iVar9._M_node == p_Var12) {
          cfd::core::ConfidentialValue::ConfidentialValue
                    ((ConfidentialValue *)&asset_1,(ConfidentialValue *)(lVar18 + 0xc0));
          outpoint_list.
          super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)cfd::core::ConfidentialValue::GetAmount();
          outpoint_list.
          super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = extraout_DL_03;
          local_170 = cfd::core::Amount::GetSatoshiValue();
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
          ::_M_emplace_unique<std::__cxx11::string&,long>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                      *)txin_amount_map,&asset_2,&local_170);
          goto LAB_00238371;
        }
        cfd::core::Txid::Txid((Txid *)&outpoint_list,(Txid *)(lVar18 + 8));
        cfd::core::OutPoint::OutPoint
                  ((OutPoint *)&asset_1,(Txid *)&outpoint_list,*(uint *)(lVar18 + 0x28));
        core::Txid::~Txid((Txid *)&outpoint_list);
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>_>_>_>
                  ::operator[](&asset_utxo_map,&asset_2);
        _Var15 = std::
                 __find_if<__gnu_cxx::__normal_iterator<cfd::core::OutPoint*,std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>>,__gnu_cxx::__ops::_Iter_equals_val<cfd::core::OutPoint_const>>
                           ((pmVar14->
                            super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                            (pmVar14->
                            super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>
                            )._M_impl.super__Vector_impl_data._M_finish,
                            (ConfidentialAssetId *)&asset_1);
        if (_Var15._M_current ==
            (pmVar14->super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>)
            ._M_impl.super__Vector_impl_data._M_finish) {
          cfd::core::ConfidentialValue::ConfidentialValue
                    ((ConfidentialValue *)&outpoint_list,(ConfidentialValue *)(lVar18 + 0xc0));
          local_170 = cfd::core::ConfidentialValue::GetAmount();
          local_168 = extraout_DL_02;
          lVar10 = cfd::core::Amount::GetSatoshiValue();
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::operator[](txin_amount_map,&asset_2);
          *pmVar11 = *pmVar11 + lVar10;
          core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&outpoint_list);
        }
        core::Txid::~Txid((Txid *)&asset_1);
      }
      else {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                ::find(&txin_amount_map->_M_t,&asset_2);
        if ((_Rb_tree_header *)iVar9._M_node == p_Var12) {
          cfd::core::ConfidentialValue::ConfidentialValue
                    ((ConfidentialValue *)&asset_1,(ConfidentialValue *)(lVar18 + 0xc0));
          outpoint_list.
          super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)cfd::core::ConfidentialValue::GetAmount();
          outpoint_list.
          super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = extraout_DL_00;
          local_170 = cfd::core::Amount::GetSatoshiValue();
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
          ::_M_emplace_unique<std::__cxx11::string&,long>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                      *)txin_amount_map,&asset_2,&local_170);
          core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&asset_1);
        }
        if ((token._M_string_length != 0) &&
           (iVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::find(&txin_amount_map->_M_t,&token),
           (_Rb_tree_header *)iVar9._M_node == p_Var12)) {
          cfd::core::ConfidentialValue::ConfidentialValue
                    ((ConfidentialValue *)&asset_1,(ConfidentialValue *)(lVar18 + 0xe8));
          outpoint_list.
          super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)cfd::core::ConfidentialValue::GetAmount();
          outpoint_list.
          super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = extraout_DL_01;
          local_170 = cfd::core::Amount::GetSatoshiValue();
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
          ::_M_emplace_unique<std::__cxx11::string&,long>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                      *)txin_amount_map,&token,&local_170);
LAB_00238371:
          core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&asset_1);
        }
      }
      std::__cxx11::string::~string((string *)&asset_2);
      core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&asset);
      std::__cxx11::string::~string((string *)&token);
      core::BlindFactor::~BlindFactor(&asset_entropy);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_1,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar18 + 0xa8));
      cVar7 = cfd::core::ByteData256::IsEmpty();
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset_1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&asset);
      if (cVar7 == '\0') goto LAB_00237f5c;
    }
    lVar18 = lVar18 + 0x160;
  } while( true );
}

Assistant:

void CollectUtxoDataByFundRawTransaction(
    const ConfidentialTransactionContext& ctx,
    const std::vector<ElementsUtxoAndOption>& selected_txin_utxos,
    std::map<std::string, int64_t>* txin_amount_map,
    std::map<std::string, int64_t>* tx_amount_map,
    std::vector<std::string>* asset_list, int32_t* fee_index) {
  const auto txout_list = ctx.GetTxOutList();
  for (size_t index = 0; index < txout_list.size(); ++index) {
    auto& txout = txout_list[index];
    if (txout.GetLockingScript().IsEmpty()) {
      // Excludes fees from collection
      *fee_index = static_cast<int32_t>(index);
    } else {
      std::string asset = txout.GetAsset().GetHex();
      if (std::find(asset_list->begin(), asset_list->end(), asset) ==
          asset_list->end()) {
        asset_list->push_back(asset);
      }

      if (tx_amount_map->find(asset) == tx_amount_map->end()) {
        int64_t amount = 0;
        tx_amount_map->emplace(asset, amount);
      }
      (*tx_amount_map)[asset] +=
          txout.GetConfidentialValue().GetAmount().GetSatoshiValue();
    }
  }
  std::map<std::string, std::vector<OutPoint>> asset_utxo_map;
  const auto txin_list = ctx.GetTxInList();  // txin_utxo_list
  for (const auto& elements_utxo : selected_txin_utxos) {
    for (const auto& txin : txin_list) {
      if ((txin.GetTxid().Equals(elements_utxo.utxo.txid)) &&
          (elements_utxo.utxo.vout == txin.GetVout())) {
        std::string asset = elements_utxo.utxo.asset.GetHex();
        if (std::find(asset_list->begin(), asset_list->end(), asset) ==
            asset_list->end()) {
          asset_list->push_back(asset);
        }
        if (asset_utxo_map.find(asset) == asset_utxo_map.end()) {
          std::vector<OutPoint> outpoint_list = {
              OutPoint(elements_utxo.utxo.txid, elements_utxo.utxo.vout)};
          asset_utxo_map[asset] = outpoint_list;
        } else {
          OutPoint outpoint(elements_utxo.utxo.txid, elements_utxo.utxo.vout);
          asset_utxo_map[asset].push_back(outpoint);
        }

        if (txin_amount_map->find(asset) == txin_amount_map->end()) {
          int64_t amount = 0;
          txin_amount_map->emplace(asset, amount);
        }
        (*txin_amount_map)[asset] +=
            elements_utxo.utxo.amount.GetSatoshiValue();
        break;
      }
    }
  }

  // append issuance txin data.
  for (const auto& txin : txin_list) {
    if (!txin.GetBlindingNonce().IsEmpty() ||
        !txin.GetAssetEntropy().IsEmpty()) {
      BlindFactor asset_entropy;
      std::string token;
      if (txin.GetBlindingNonce().IsEmpty()) {
        asset_entropy = ConfidentialTransaction::CalculateAssetEntropy(
            txin.GetTxid(), txin.GetVout(), txin.GetAssetEntropy());
        ConfidentialAssetId token1 =
            ConfidentialTransaction::CalculateReissuanceToken(
                asset_entropy, true);
        ConfidentialAssetId token2 =
            ConfidentialTransaction::CalculateReissuanceToken(
                asset_entropy, false);
        std::string token_blind = token1.GetHex();
        std::string token_unblind = token2.GetHex();
        if (tx_amount_map->find(token_blind) != tx_amount_map->end()) {
          token = token_blind;
        } else if (
            tx_amount_map->find(token_unblind) != tx_amount_map->end()) {
          token = token_unblind;
        }
      } else {
        asset_entropy = BlindFactor(txin.GetAssetEntropy());
      }
      ConfidentialAssetId asset_id =
          ConfidentialTransaction::CalculateAsset(asset_entropy);
      std::string asset = asset_id.GetHex();

      if (txin.GetBlindingNonce().IsEmpty()) {
        // At the time of issuance, add to map if it is not registered.
        if (txin_amount_map->find(asset) == txin_amount_map->end()) {
          txin_amount_map->emplace(
              asset, txin.GetIssuanceAmount().GetAmount().GetSatoshiValue());
        }
        if ((!token.empty()) &&
            (txin_amount_map->find(token) == txin_amount_map->end())) {
          txin_amount_map->emplace(
              token, txin.GetInflationKeys().GetAmount().GetSatoshiValue());
        }
      } else if (txin_amount_map->find(asset) == txin_amount_map->end()) {
        // At the time of reissuance, add to map if it is not registered asset.
        txin_amount_map->emplace(
            asset, txin.GetIssuanceAmount().GetAmount().GetSatoshiValue());
      } else {
        // At the time of reissuance,
        // add to map if it is not registered asset of utxo.
        OutPoint outpoint(txin.GetTxid(), txin.GetVout());
        std::vector<OutPoint>& outpoint_list = asset_utxo_map[asset];
        if (std::find(outpoint_list.begin(), outpoint_list.end(), outpoint) ==
            outpoint_list.end()) {
          (*txin_amount_map)[asset] +=
              txin.GetIssuanceAmount().GetAmount().GetSatoshiValue();
        }
      }
    }
  }
}